

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVDBase.h
# Opt level: O0

void __thiscall
Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>::SVDBase
          (SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_> *this)

{
  SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_> *this_local;
  
  SolverBase<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>_>::SolverBase
            ((SolverBase<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>_>
              *)this);
  Matrix<float,_3,_3,_0,_3,_3>::Matrix(&this->m_matrixU);
  Matrix<float,_3,_3,_0,_3,_3>::Matrix(&this->m_matrixV);
  Matrix<float,_3,_1,_0,_3,_1>::Matrix(&this->m_singularValues);
  this->m_info = Success;
  this->m_isInitialized = false;
  this->m_isAllocated = false;
  this->m_usePrescribedThreshold = false;
  this->m_computeFullU = false;
  this->m_computeThinU = false;
  this->m_computeFullV = false;
  this->m_computeThinV = false;
  this->m_computationOptions = 0;
  this->m_rows = -1;
  this->m_cols = -1;
  this->m_diagSize = 0;
  check_template_parameters();
  return;
}

Assistant:

SVDBase()
    : m_info(Success),
      m_isInitialized(false),
      m_isAllocated(false),
      m_usePrescribedThreshold(false),
      m_computeFullU(false),
      m_computeThinU(false),
      m_computeFullV(false),
      m_computeThinV(false),
      m_computationOptions(0),
      m_rows(-1), m_cols(-1), m_diagSize(0)
  {
    check_template_parameters();
  }